

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1522.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  curl_off_t uploadSize;
  
  uVar2 = curl_easy_init();
  memset(g_Data,0x41,0xa000);
  curl_easy_setopt(uVar2,0x4eb4,sockopt_callback);
  curl_easy_setopt(uVar2,0x2712,URL);
  curl_easy_setopt(uVar2,0x271f,g_Data);
  curl_easy_setopt(uVar2,0x3c,0xa000);
  uVar3 = curl_slist_append(0,"Expect:");
  curl_easy_setopt(uVar2,0x2727,uVar3);
  iVar1 = curl_easy_perform(uVar2);
  if (iVar1 == 0) {
    curl_easy_getinfo(uVar2,0x600007,&uploadSize);
    curl_mprintf("uploadSize = %ld\n",uploadSize);
    pcVar4 = "!!!!!!!!!! FAIL\n";
    if (uploadSize == 0xa000) {
      pcVar4 = "!!!!!!!!!! PASS\n";
    }
    curl_mprintf(pcVar4);
  }
  else {
    curl_mprintf("curl_easy_perform() failed. e = %d\n",iVar1);
  }
  curl_slist_free_all(uVar3);
  curl_easy_cleanup(uVar2);
  return 0;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  struct curl_slist *pHeaderList = NULL;
  CURL *pCurl = curl_easy_init();
  memset(g_Data, 'A', sizeof(g_Data)); /* send As! */

  curl_easy_setopt(pCurl, CURLOPT_SOCKOPTFUNCTION, sockopt_callback);
  curl_easy_setopt(pCurl, CURLOPT_URL, URL);
  curl_easy_setopt(pCurl, CURLOPT_POSTFIELDS, g_Data);
  curl_easy_setopt(pCurl, CURLOPT_POSTFIELDSIZE, (long)sizeof(g_Data));

  /* Remove "Expect: 100-continue" */
  pHeaderList = curl_slist_append(pHeaderList, "Expect:");

  curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, pHeaderList);

  code = curl_easy_perform(pCurl);

  if(code == CURLE_OK) {
    curl_off_t uploadSize;
    curl_easy_getinfo(pCurl, CURLINFO_SIZE_UPLOAD_T, &uploadSize);

    printf("uploadSize = %ld\n", (long)uploadSize);

    if((size_t) uploadSize == sizeof(g_Data)) {
      printf("!!!!!!!!!! PASS\n");
    }
    else {
      printf("!!!!!!!!!! FAIL\n");
    }
  }
  else {
    printf("curl_easy_perform() failed. e = %d\n", code);
  }

  curl_slist_free_all(pHeaderList);
  curl_easy_cleanup(pCurl);

  return 0;
}